

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_column_removal<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
               (void)

{
  Underlying_matrix *this;
  Column *col;
  Index columnIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *b;
  pointer witness;
  shared_count sStack_250;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  undefined **local_230;
  undefined1 local_228;
  _Base_ptr local_220;
  char *local_218;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>
              *)&m,&columns,5);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
            (&columns,&m);
  this = &m.matrix_;
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
  ::remove_column(this,2);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
  ::remove_column(this,4);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x341);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
  ::get_column(this,2);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x341);
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_228 = _S_red;
  local_230 = &PTR__lazy_ostream_001a3818;
  local_220 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_218 = "exception std::logic_error expected but not raised";
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_250);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x342);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
  ::get_column(this,4);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x342);
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_228 = _S_red;
  local_230 = &PTR__lazy_ostream_001a3818;
  local_220 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_218 = "exception std::logic_error expected but not raised";
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_250);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::erase(&columns,columns.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::erase(&columns,columns.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2);
  columnIndex = 0;
  for (witness = columns.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      witness !=
      columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; witness = witness + 1) {
    if ((columnIndex == 4) || (columnIndex == 2)) {
      columnIndex = columnIndex | 1;
    }
    col = Gudhi::persistence_matrix::
          Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
          ::get_column(this,columnIndex);
    get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>
              ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>
                *)&local_230,col);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>
              (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>
                        *)&local_230);
    columnIndex = columnIndex + 1;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_230);
  }
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_column_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.remove_column(2);
  m.remove_column(4);
  BOOST_CHECK_THROW(m.get_column(2), std::logic_error);
  BOOST_CHECK_THROW(m.get_column(4), std::logic_error);

  columns.erase(columns.begin() + 4);
  columns.erase(columns.begin() + 2);
  unsigned int i = 0;
  for (auto& b : columns) {
    if (i == 2 || i == 4) ++i;
    test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++)));
  }

  if constexpr (!Matrix::Option_list::has_row_access) {
    m.insert_column(witness_content<typename Matrix::Column>{}, 2);
    BOOST_CHECK_NO_THROW(m.get_column(2));
    BOOST_CHECK_THROW(m.get_column(4), std::logic_error);
  }
}